

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall RenderTarget::add(RenderTarget *this,Renderable *object)

{
  ulong uVar1;
  size_type sVar2;
  reference ppRVar3;
  __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
  local_80;
  const_iterator local_78;
  __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
  local_68;
  __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
  local_60;
  __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
  local_58;
  const_iterator local_50;
  int local_44;
  int i_1;
  __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
  local_38;
  __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
  local_30;
  const_iterator local_28;
  uint local_1c;
  Renderable *pRStack_18;
  uint i;
  Renderable *object_local;
  RenderTarget *this_local;
  
  object->depth = depth;
  pRStack_18 = object;
  object_local = (Renderable *)this;
  for (local_1c = 0; uVar1 = (ulong)local_1c,
      sVar2 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                        (&this->objects), uVar1 < sVar2; local_1c = local_1c + 1) {
    ppRVar3 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                        (&this->objects,(ulong)local_1c);
    if ((*ppRVar3)->depth < depth) {
      local_38._M_current =
           (Renderable **)
           std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::begin
                     (&this->objects);
      local_30 = __gnu_cxx::
                 __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
                 ::operator+(&local_38,(ulong)local_1c);
      __gnu_cxx::
      __normal_iterator<nite::Renderable*const*,std::vector<nite::Renderable*,std::allocator<nite::Renderable*>>>
      ::__normal_iterator<nite::Renderable**>
                ((__normal_iterator<nite::Renderable*const*,std::vector<nite::Renderable*,std::allocator<nite::Renderable*>>>
                  *)&local_28,&local_30);
      std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
                (&this->objects,local_28,&stack0xffffffffffffffe8);
      return;
    }
  }
  sVar2 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size(&this->objects)
  ;
  local_44 = (int)sVar2;
  do {
    local_44 = local_44 + -1;
    if (local_44 < 0) {
      local_80._M_current =
           (Renderable **)
           std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::end(&this->objects)
      ;
      __gnu_cxx::
      __normal_iterator<nite::Renderable*const*,std::vector<nite::Renderable*,std::allocator<nite::Renderable*>>>
      ::__normal_iterator<nite::Renderable**>
                ((__normal_iterator<nite::Renderable*const*,std::vector<nite::Renderable*,std::allocator<nite::Renderable*>>>
                  *)&local_78,&local_80);
      std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
                (&this->objects,local_78,&stack0xffffffffffffffe8);
      return;
    }
    ppRVar3 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                        (&this->objects,(long)local_44);
  } while ((*ppRVar3)->depth != depth);
  local_68._M_current =
       (Renderable **)
       std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::begin(&this->objects);
  local_60 = __gnu_cxx::
             __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
             ::operator+(&local_68,(long)local_44);
  local_58 = __gnu_cxx::
             __normal_iterator<nite::Renderable_**,_std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>_>
             ::operator+(&local_60,1);
  __gnu_cxx::
  __normal_iterator<nite::Renderable*const*,std::vector<nite::Renderable*,std::allocator<nite::Renderable*>>>
  ::__normal_iterator<nite::Renderable**>
            ((__normal_iterator<nite::Renderable*const*,std::vector<nite::Renderable*,std::allocator<nite::Renderable*>>>
              *)&local_50,&local_58);
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
            (&this->objects,local_50,&stack0xffffffffffffffe8);
  return;
}

Assistant:

void add(Renderable *object){
		object->depth = depth;
		for(unsigned i = 0; i < objects.size(); ++i){
			if(objects[i]->depth < depth){
				objects.insert(objects.begin()+i, object);
				return;
			}
		}
		for(int i = objects.size()-1; i >= 0; i--){
			if(objects[i]->depth == depth){
				objects.insert(objects.begin()+i+1, object);
				return;
			}
		}
		objects.insert(objects.end(), object);

	}